

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keywords.cpp
# Opt level: O3

SyntaxKind psy::C::Lexer::translate(char *s,int n,ParseOptions *opts)

{
  byte bVar1;
  char cVar2;
  SyntaxKind SVar3;
  
  SVar3 = IdentifierToken;
  switch(n) {
  case 2:
    if (*s != 'o') {
      return IdentifierToken;
    }
    SVar3 = BarBarToken;
    cVar2 = s[1];
    break;
  case 3:
    cVar2 = *s;
    if (cVar2 != 'x') {
      if (cVar2 == 'n') {
        if (s[1] != 'o') {
          return IdentifierToken;
        }
        if (s[2] == 't') {
          return ExclamationToken;
        }
        return IdentifierToken;
      }
      if (cVar2 != 'a') {
        return IdentifierToken;
      }
      if (s[1] == 'n') {
        if (s[2] == 'd') {
          return AmpersandAmpersandToken;
        }
        return IdentifierToken;
      }
      return IdentifierToken;
    }
    if (s[1] != 'o') {
      return IdentifierToken;
    }
    SVar3 = CaretToken;
    cVar2 = s[2];
    break;
  default:
    goto switchD_002af064_caseD_4;
  case 5:
    cVar2 = *s;
    if (cVar2 == 'o') {
      if (s[1] != 'r') {
        return IdentifierToken;
      }
      if (s[2] != '_') {
        return IdentifierToken;
      }
      if (s[3] != 'e') {
        return IdentifierToken;
      }
      SVar3 = BarEqualsToken;
      cVar2 = s[4];
      goto joined_r0x002af261;
    }
    if (cVar2 == 'c') {
      if (s[1] != 'o') {
        return IdentifierToken;
      }
      if (s[2] != 'm') {
        return IdentifierToken;
      }
      if (s[3] != 'p') {
        return IdentifierToken;
      }
      if (s[4] != 'l') {
        return IdentifierToken;
      }
      return OperatorName_COMPLToken;
    }
    if (cVar2 != 'b') {
      return IdentifierToken;
    }
    if (s[1] != 'i') {
      return IdentifierToken;
    }
    if (s[2] != 't') {
      return IdentifierToken;
    }
    if (s[3] != 'o') {
      return IdentifierToken;
    }
    SVar3 = BarToken;
    cVar2 = s[4];
    break;
  case 6:
    bVar1 = *s;
    if (bVar1 < 0x6e) {
      if (bVar1 != 0x61) {
        if (bVar1 != 0x62) {
          return IdentifierToken;
        }
        if (s[1] != 'i') {
          return IdentifierToken;
        }
        if (s[2] != 't') {
          return IdentifierToken;
        }
        if (s[3] != 'a') {
          return IdentifierToken;
        }
        if (s[4] != 'n') {
          return IdentifierToken;
        }
        if (s[5] != 'd') {
          return IdentifierToken;
        }
        return AmpersandToken;
      }
      if (s[1] != 'n') {
        return IdentifierToken;
      }
      if (s[2] != 'd') {
        return IdentifierToken;
      }
      if (s[3] != '_') {
        return IdentifierToken;
      }
      if (s[4] != 'e') {
        return IdentifierToken;
      }
      SVar3 = AmpersandEqualsToken;
    }
    else if (bVar1 == 0x6e) {
      if (s[1] != 'o') {
        return IdentifierToken;
      }
      if (s[2] != 't') {
        return IdentifierToken;
      }
      if (s[3] != '_') {
        return IdentifierToken;
      }
      if (s[4] != 'e') {
        return IdentifierToken;
      }
      SVar3 = ExclamationEqualsToken;
    }
    else {
      if (bVar1 != 0x78) {
        return IdentifierToken;
      }
      if (s[1] != 'o') {
        return IdentifierToken;
      }
      if (s[2] != 'r') {
        return IdentifierToken;
      }
      if (s[3] != '_') {
        return IdentifierToken;
      }
      if (s[4] != 'e') {
        return IdentifierToken;
      }
      SVar3 = CaretEqualsToken;
    }
    cVar2 = s[5];
joined_r0x002af261:
    if (cVar2 != 'q') {
      return IdentifierToken;
    }
    goto switchD_002af064_caseD_4;
  }
  if (cVar2 != 'r') {
    return IdentifierToken;
  }
switchD_002af064_caseD_4:
  return SVar3;
}

Assistant:

SyntaxKind Lexer::translate(const char* s, int n, const ParseOptions& opts)
{
    switch (n) {
        case 2: return translate2(s);
        case 3: return translate3(s);
        case 5: return translate5(s);
        case 6: return translate6(s);
        default: return SyntaxKind::IdentifierToken;
    }
}